

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapPerm.c
# Opt level: O1

void Amap_LibVerifyPerm(Amap_Lib_t *pLib,Amap_Gat_t *pGate,Kit_DsdNtk_t *pNtk,Amap_Nod_t *pNod,
                       int *pArray)

{
  undefined4 uVar1;
  void *pvVar2;
  uint nWords_00;
  long lVar3;
  Vec_Int_t *__ptr;
  Amap_Nod_t *pAVar4;
  int *piVar5;
  void *__ptr_00;
  ulong uVar6;
  Vec_Ptr_t *vTtElems;
  void **ppvVar7;
  uint *puVar8;
  byte bVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  int nWords;
  uint uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  int iInput;
  uint local_54;
  Kit_DsdNtk_t *local_50;
  Vec_Int_t *local_48;
  Amap_Lib_t *local_40;
  Amap_Nod_t *local_38;
  
  local_54 = 0;
  uVar13 = *(uint *)&pGate->field_0x38;
  local_50 = pNtk;
  local_40 = pLib;
  local_38 = pNod;
  if (uVar13 < 0x2000000) {
    __assert_fail("pGate->nPins > 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/amap/amapPerm.c"
                  ,0x122,
                  "void Amap_LibVerifyPerm(Amap_Lib_t *, Amap_Gat_t *, Kit_DsdNtk_t *, Amap_Nod_t *, int *)"
                 );
  }
  uVar16 = uVar13 >> 0x18;
  uVar12 = (ulong)uVar16;
  bVar9 = (char)(uVar13 >> 0x18) - 5;
  uVar15 = 0xf << (bVar9 & 0x1f);
  if (uVar15 < 0x11) {
    uVar15 = 0x10;
  }
  local_48 = (Vec_Int_t *)malloc(0x10);
  nWords_00 = 1 << (bVar9 & 0x1f);
  if (uVar13 < 0x6000000) {
    uVar15 = 0x10;
    nWords_00 = 1;
  }
  local_48->nSize = 0;
  local_48->nCap = uVar15;
  piVar5 = (int *)malloc((long)(int)uVar15 << 2);
  local_48->pArray = piVar5;
  __ptr_00 = malloc(((long)(int)nWords_00 * 4 + 8) * uVar12);
  uVar6 = (ulong)(uVar16 * 8);
  uVar10 = 0;
  do {
    *(ulong *)((long)__ptr_00 + uVar10 * 8) = (long)__ptr_00 + uVar6;
    uVar10 = uVar10 + 1;
    uVar6 = uVar6 + (long)(int)nWords_00 * 4;
  } while (uVar12 != uVar10);
  uVar6 = 0;
  do {
    lVar11 = *(long *)((long)__ptr_00 + uVar6 * 8);
    if (uVar6 < 5) {
      if (0 < (int)nWords_00) {
        uVar1 = (&DAT_008ad1e0)[uVar6];
        uVar10 = 0;
        do {
          *(undefined4 *)(lVar11 + uVar10 * 4) = uVar1;
          uVar10 = uVar10 + 1;
        } while (nWords_00 != uVar10);
      }
    }
    else if (0 < (int)nWords_00) {
      uVar10 = 0;
      do {
        *(uint *)(lVar11 + uVar10 * 4) =
             -(uint)((1 << ((char)uVar6 - 5U & 0x1f) & (uint)uVar10) != 0);
        uVar10 = uVar10 + 1;
      } while (nWords_00 != uVar10);
    }
    uVar6 = uVar6 + 1;
  } while (uVar6 != uVar12);
  uVar15 = *(uint *)&pGate->field_0x38 >> 0x18;
  vTtElems = (Vec_Ptr_t *)malloc(0x10);
  uVar13 = 8;
  if (6 < uVar15 - 1) {
    uVar13 = uVar15;
  }
  vTtElems->nSize = 0;
  vTtElems->nCap = uVar13;
  if (uVar13 == 0) {
    ppvVar7 = (void **)0x0;
  }
  else {
    ppvVar7 = (void **)malloc((ulong)(uVar13 << 3));
  }
  vTtElems->pArray = ppvVar7;
  uVar13 = *(uint *)&pGate->field_0x38;
  if (0xffffff < uVar13) {
    uVar12 = (ulong)(uVar13 >> 0x18);
    uVar6 = 0;
    do {
      uVar15 = pArray[uVar6];
      if ((int)uVar15 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf2,"int Abc_Lit2Var(int)");
      }
      if (uVar16 <= uVar15 >> 1) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar2 = *(void **)((long)__ptr_00 + (ulong)(uVar15 >> 1) * 8);
      if ((uVar15 & 1) != 0) {
        uVar15 = 1 << ((char)uVar12 - 5U & 0x1f);
        if (uVar13 < 0x6000000) {
          uVar15 = 1;
        }
        if (0 < (int)uVar15) {
          lVar11 = (ulong)uVar15 + 1;
          do {
            puVar8 = (uint *)((long)pvVar2 + lVar11 * 4 + -8);
            *puVar8 = ~*puVar8;
            lVar11 = lVar11 + -1;
          } while (1 < lVar11);
        }
      }
      uVar13 = vTtElems->nCap;
      if (vTtElems->nSize == uVar13) {
        if ((int)uVar13 < 0x10) {
          if (vTtElems->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc(0x80);
          }
          else {
            ppvVar7 = (void **)realloc(vTtElems->pArray,0x80);
          }
          iVar14 = 0x10;
        }
        else {
          iVar14 = uVar13 * 2;
          if (iVar14 <= (int)uVar13) goto LAB_003caa9e;
          if (vTtElems->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc((ulong)uVar13 << 4);
          }
          else {
            ppvVar7 = (void **)realloc(vTtElems->pArray,(ulong)uVar13 << 4);
          }
        }
        vTtElems->pArray = ppvVar7;
        vTtElems->nCap = iVar14;
      }
LAB_003caa9e:
      iVar14 = vTtElems->nSize;
      vTtElems->nSize = iVar14 + 1;
      vTtElems->pArray[iVar14] = pvVar2;
      uVar6 = uVar6 + 1;
      uVar13 = *(uint *)&pGate->field_0x38;
      uVar12 = (ulong)(uVar13 >> 0x18);
    } while (uVar6 < uVar12);
  }
  pAVar4 = local_38;
  __ptr = local_48;
  puVar8 = Amap_LibVerifyPerm_rec(local_40,local_38,vTtElems,local_48,nWords_00,(int *)&local_54);
  uVar13 = *(uint *)&pGate->field_0x38;
  if (local_54 != uVar13 >> 0x18) {
    __assert_fail("iInput == (int)pGate->nPins",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/amap/amapPerm.c"
                  ,0x132,
                  "void Amap_LibVerifyPerm(Amap_Lib_t *, Amap_Gat_t *, Kit_DsdNtk_t *, Amap_Nod_t *, int *)"
                 );
  }
  if ((local_50->Root & 1) != 0) {
    uVar15 = 1 << ((char)(uVar13 >> 0x18) - 5U & 0x1f);
    if (uVar13 < 0x6000000) {
      uVar15 = 1;
    }
    if (0 < (int)uVar15) {
      lVar11 = (ulong)uVar15 + 1;
      do {
        puVar8[lVar11 + -2] = ~puVar8[lVar11 + -2];
        lVar11 = lVar11 + -1;
      } while (1 < lVar11);
    }
  }
  uVar13 = *(uint *)&pGate->field_0x38;
  uVar12 = (ulong)(uint)(1 << ((char)(uVar13 >> 0x18) - 5U & 0x1f));
  if (uVar13 < 0x6000000) {
    uVar12 = 1;
  }
  do {
    iVar14 = (int)uVar12;
    if (iVar14 < 1) goto LAB_003ca989;
    lVar11 = uVar12 - 1;
    lVar3 = uVar12 - 1;
    uVar12 = uVar12 - 1;
  } while (pGate->pFunc[lVar11] == puVar8[lVar3]);
  if (0 < iVar14) {
    printf("Verification failed for gate %d (%s) and node %d.\n",(ulong)(uVar13 & 0x7fffff),
           pGate->pForm,(ulong)*(ushort *)pAVar4);
  }
LAB_003ca989:
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (int *)0x0;
  }
  free(__ptr);
  if (__ptr_00 != (void *)0x0) {
    free(__ptr_00);
  }
  if (vTtElems->pArray != (void **)0x0) {
    free(vTtElems->pArray);
    vTtElems->pArray = (void **)0x0;
  }
  free(vTtElems);
  return;
}

Assistant:

void Amap_LibVerifyPerm( Amap_Lib_t * pLib, Amap_Gat_t * pGate, Kit_DsdNtk_t * pNtk, Amap_Nod_t * pNod, int * pArray )
{
    Vec_Ptr_t * vTtElems;
    Vec_Ptr_t * vTtElemsPol;
    Vec_Int_t * vTruth;
    unsigned * pTruth;
    int i, nWords;
    int iInput = 0;

    // allocate storage for truth tables
    assert( pGate->nPins > 1 );
    nWords = Kit_TruthWordNum( pGate->nPins );
    vTruth = Vec_IntAlloc( nWords * AMAP_MAXINS );
    vTtElems = Vec_PtrAllocTruthTables( pGate->nPins );
    vTtElemsPol = Vec_PtrAlloc( pGate->nPins );
    for ( i = 0; i < (int)pGate->nPins; i++ )
    {
        pTruth = (unsigned *)Vec_PtrEntry( vTtElems, Abc_Lit2Var(pArray[i]) );
        if ( Abc_LitIsCompl( pArray[i] ) )
            Kit_TruthNot( pTruth, pTruth, pGate->nPins );
        Vec_PtrPush( vTtElemsPol, pTruth );
    }
//Extra_PrintBinary( stdout, Vec_PtrEntry(vTtElemsPol, 0), 4 ); printf("\n" );
//Extra_PrintBinary( stdout, Vec_PtrEntry(vTtElemsPol, 1), 4 ); printf("\n" );
    // compute the truth table recursively
    pTruth = Amap_LibVerifyPerm_rec( pLib, pNod, vTtElemsPol, vTruth, nWords, &iInput );
    assert( iInput == (int)pGate->nPins );
    if ( Abc_LitIsCompl(pNtk->Root) )
        Kit_TruthNot( pTruth, pTruth, pGate->nPins );
//Extra_PrintBinary( stdout, pTruth, 4 ); printf("\n" );
//Extra_PrintBinary( stdout, pGate->pFunc, 4 ); printf("\n" );
    // compare
    if ( !Kit_TruthIsEqual(pGate->pFunc, pTruth, pGate->nPins) )
        printf( "Verification failed for gate %d (%s) and node %d.\n",
            pGate->Id, pGate->pForm, pNod->Id );
    Vec_IntFree( vTruth );
    Vec_PtrFree( vTtElems );
    Vec_PtrFree( vTtElemsPol );
}